

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdExtaddPairwise<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,wabt::interp::Simd<unsigned_short,(unsigned_char)8>>
          (Thread *this)

{
  undefined1 auVar1 [16];
  Value VVar2;
  Value value;
  
  VVar2 = Pop(this);
  auVar1 = _DAT_00156160 & (undefined1  [16])VVar2.field_0;
  value.field_0.i64_._4_4_ = (VVar2.field_0._4_4_ >> 0x10) + auVar1._4_4_;
  value.field_0.i32_ = (VVar2.field_0.i32_ >> 0x10) + auVar1._0_4_;
  value.field_0._12_4_ = (VVar2.field_0._12_4_ >> 0x10) + auVar1._12_4_;
  value.field_0._8_4_ = (VVar2.field_0._8_4_ >> 0x10) + auVar1._8_4_;
  Push(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdExtaddPairwise() {
  auto val = Pop<T>();
  S result;
  using U = typename S::LaneType;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = i * 2;
    result[i] = U(val[laneidx]) + U(val[laneidx + 1]);
  }
  Push(result);
  return RunResult::Ok;
}